

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     PlotShadedEx<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>>
               (char *label_id,GetterXsYs<unsigned_long_long> *getter1,
               GetterXsYRef<unsigned_long_long> *getter2,bool fit2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  unsigned_long_long *puVar7;
  unsigned_long_long *puVar8;
  ImPlotPlot *pIVar9;
  unsigned_long_long uVar10;
  unsigned_long_long uVar11;
  double dVar12;
  double dVar13;
  ImPlotRange *pIVar14;
  ImPlotContext *pIVar15;
  bool bVar16;
  ImU32 col;
  long lVar17;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  byte local_8c;
  byte local_88;
  TransformerLinLin local_84;
  GetterXsYRef<unsigned_long_long> *local_80;
  GetterXsYs<unsigned_long_long> *local_78;
  undefined8 local_70;
  undefined4 local_64;
  ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
  local_60;
  
  bVar16 = BeginItem(label_id,1);
  pIVar15 = GImPlot;
  if (bVar16) {
    if (GImPlot->FitThisFrame == true) {
      local_64 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar1 = getter1->Count;
      if (0 < iVar1) {
        puVar7 = getter1->Xs;
        puVar8 = getter1->Ys;
        iVar2 = getter1->Offset;
        iVar3 = getter1->Stride;
        pIVar9 = GImPlot->CurrentPlot;
        iVar4 = pIVar9->CurrentYAxis;
        uVar5 = (pIVar9->XAxis).Flags;
        pIVar14 = GImPlot->ExtentsY;
        uVar6 = pIVar9->YAxis[iVar4].Flags;
        iVar20 = 0;
        uVar19 = uVar6 & 0x20;
        local_70 = (double)(CONCAT44(local_70._4_4_,uVar5) & 0xffffffff00000020);
        do {
          lVar17 = (long)(((iVar2 + iVar20) % iVar1 + iVar1) % iVar1) * (long)iVar3;
          uVar10 = *(unsigned_long_long *)((long)puVar7 + lVar17);
          auVar24._8_4_ = (int)(uVar10 >> 0x20);
          auVar24._0_8_ = uVar10;
          auVar24._12_4_ = 0x45300000;
          dVar26 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          uVar11 = *(unsigned_long_long *)((long)puVar8 + lVar17);
          auVar27._8_4_ = (int)(uVar11 >> 0x20);
          auVar27._0_8_ = uVar11;
          auVar27._12_4_ = 0x45300000;
          dVar23 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
          if ((uVar5 >> 10 & 1) == 0) {
            if ((uVar10 != 0) || ((int)local_70 == 0)) {
LAB_001eb81b:
              dVar12 = (pIVar15->ExtentsX).Min;
              dVar13 = (pIVar15->ExtentsX).Max;
              uVar21 = -(ulong)(dVar26 < dVar12);
              uVar22 = -(ulong)(dVar13 < dVar26);
              auVar30._0_8_ = (ulong)dVar26 & uVar21;
              auVar30._8_8_ = (ulong)dVar26 & uVar22;
              auVar34._0_8_ = ~uVar21 & (ulong)dVar12;
              auVar34._8_8_ = ~uVar22 & (ulong)dVar13;
              pIVar15->ExtentsX = (ImPlotRange)(auVar34 | auVar30);
            }
          }
          else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar23) &&
                   (dVar23 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)((uVar5 & 0x20) >> 5), (uVar10 == 0 & local_8c) == 0))
          goto LAB_001eb81b;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((uVar11 != 0) || (uVar19 == 0)) {
LAB_001eb887:
              dVar26 = pIVar14[iVar4].Min;
              dVar12 = pIVar15->ExtentsY[iVar4].Max;
              uVar21 = -(ulong)(dVar23 < dVar26);
              uVar22 = -(ulong)(dVar12 < dVar23);
              auVar25._0_8_ = (ulong)dVar23 & uVar21;
              auVar25._8_8_ = (ulong)dVar23 & uVar22;
              auVar31._0_8_ = ~uVar21 & (ulong)dVar26;
              auVar31._8_8_ = ~uVar22 & (ulong)dVar12;
              pIVar14[iVar4] = (ImPlotRange)(auVar31 | auVar25);
            }
          }
          else if ((((pIVar9->XAxis).Range.Min <= dVar26) && (dVar26 <= (pIVar9->XAxis).Range.Max))
                  && (local_88 = (byte)(uVar19 >> 5), (uVar11 == 0 & local_88) == 0))
          goto LAB_001eb887;
          iVar20 = iVar20 + 1;
        } while (iVar1 != iVar20);
      }
      if ((fit2) && (iVar1 = getter2->Count, 0 < iVar1)) {
        puVar7 = getter2->Xs;
        iVar2 = getter2->Offset;
        iVar3 = getter2->Stride;
        dVar23 = getter2->YRef;
        pIVar9 = pIVar15->CurrentPlot;
        iVar4 = pIVar9->CurrentYAxis;
        uVar5 = (pIVar9->XAxis).Flags;
        uVar6 = pIVar9->YAxis[iVar4].Flags;
        local_70 = ABS(dVar23);
        bVar18 = dVar23 <= 0.0 & (byte)((uVar6 & 0x20) >> 5);
        iVar20 = 0;
        uVar19 = uVar5 & 0x20;
        do {
          uVar10 = *(unsigned_long_long *)
                    ((long)puVar7 + (long)(((iVar2 + iVar20) % iVar1 + iVar1) % iVar1) * (long)iVar3
                    );
          auVar28._8_4_ = (int)(uVar10 >> 0x20);
          auVar28._0_8_ = uVar10;
          auVar28._12_4_ = 0x45300000;
          dVar26 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar10) - 4503599627370496.0);
          if ((uVar5 >> 10 & 1) == 0) {
            if ((uVar10 != 0) || (uVar19 == 0)) {
LAB_001eb9e7:
              dVar12 = (pIVar15->ExtentsX).Min;
              dVar13 = (pIVar15->ExtentsX).Max;
              uVar21 = -(ulong)(dVar26 < dVar12);
              uVar22 = -(ulong)(dVar13 < dVar26);
              auVar32._0_8_ = (ulong)dVar26 & uVar21;
              auVar32._8_8_ = (ulong)dVar26 & uVar22;
              auVar35._0_8_ = ~uVar21 & (ulong)dVar12;
              auVar35._8_8_ = ~uVar22 & (ulong)dVar13;
              pIVar15->ExtentsX = (ImPlotRange)(auVar35 | auVar32);
            }
          }
          else if (((pIVar9->YAxis[iVar4].Range.Min <= dVar23) &&
                   (dVar23 <= pIVar9->YAxis[iVar4].Range.Max)) &&
                  (local_8c = (byte)(uVar19 >> 5), (uVar10 == 0 & local_8c) == 0))
          goto LAB_001eb9e7;
          if ((uVar6 >> 10 & 1) == 0) {
            if ((ulong)local_70 < 0x7ff0000000000000 && bVar18 == 0) {
LAB_001eba2f:
              dVar26 = pIVar15->ExtentsY[iVar4].Min;
              dVar12 = pIVar15->ExtentsY[iVar4].Max;
              uVar21 = -(ulong)(dVar23 < dVar26);
              uVar22 = -(ulong)(dVar12 < dVar23);
              auVar29._0_8_ = (ulong)dVar23 & uVar21;
              auVar29._8_8_ = (ulong)dVar23 & uVar22;
              auVar33._0_8_ = ~uVar21 & (ulong)dVar26;
              auVar33._8_8_ = ~uVar22 & (ulong)dVar12;
              pIVar15->ExtentsY[iVar4] = (ImPlotRange)(auVar33 | auVar29);
            }
          }
          else if (((ulong)local_70 < 0x7ff0000000000000 && bVar18 == 0) &&
                   (dVar26 <= (pIVar9->XAxis).Range.Max && (pIVar9->XAxis).Range.Min <= dVar26))
          goto LAB_001eba2f;
          iVar20 = iVar20 + 1;
        } while (iVar1 != iVar20);
      }
    }
    local_80 = getter2;
    local_78 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar15->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar15->NextItemData).Colors + 1);
      iVar1 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar1]) {
      case 0:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLin>
        ::ShadedRenderer(&local_60,local_78,local_80,&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
                          *)&local_60,local_78,local_80,(TransformerLogLin *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
                          *)&local_60,local_78,local_80,(TransformerLinLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_84.YAxis = iVar1;
        ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
        ::ShadedRenderer((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                          *)&local_60,local_78,local_80,(TransformerLogLog *)&local_84,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar15 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar15->NextItemData);
    pIVar15->PreviousItem = pIVar15->CurrentItem;
    pIVar15->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}